

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O2

void __thiscall hmi::window::window(window *this,string_view title,vec2i size,window_flags hints)

{
  int iVar1;
  SDL_Window *pSVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  allocator<char> local_59;
  string_view title_local;
  string title_string;
  
  title_local._M_str = title._M_str;
  title_local._M_len = title._M_len;
  this->m_window = (SDL_Window *)0x0;
  this->m_should_close = false;
  LOCK();
  iVar1 = (anonymous_namespace)::g_loaded + 1;
  UNLOCK();
  bVar5 = (anonymous_namespace)::g_loaded == 0;
  (anonymous_namespace)::g_loaded = iVar1;
  if (bVar5) {
    iVar1 = SDL_Init(0x20);
    if (iVar1 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to initialize SDL: ");
      pcVar4 = (char *)SDL_GetError();
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3,'\n');
      return;
    }
    SDL_GL_SetAttribute(0x15,4);
    SDL_GL_SetAttribute(0x11,2);
    SDL_GL_SetAttribute(0x12,0);
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&title_string,&title_local,&local_59);
  pSVar2 = (SDL_Window *)
           SDL_CreateWindow(title_string._M_dataplus._M_p,0x2fff0000,0x2fff0000,
                            (ulong)size.field_0 & 0xffffffff,(ulong)size.field_0 >> 0x20,
                            (hints & resizable) * 0x20 +
                            (hints & decorated) * 4 + (uint)((hints & visible) == none) * 4 + 6 ^
                            0x10);
  this->m_window = pSVar2;
  if (pSVar2 == (SDL_Window *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to create window: ");
    pcVar4 = (char *)SDL_GetError();
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,'\n');
  }
  std::__cxx11::string::~string((string *)&title_string);
  return;
}

Assistant:

window::window(std::string_view title, vec2i size, window_flags hints)
  : m_window(nullptr)
  , m_should_close(false)
  {
    if (g_loaded.fetch_add(1) == 0) { // we are the first
      if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        std::cerr << "Unable to initialize SDL: " << SDL_GetError() << '\n';
        return;
      }

      // must be set before window creating
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_ES);
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 2);
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
    }

    std::string title_string(title);
    auto flags = compute_sdl_flags(hints);
    m_window = SDL_CreateWindow(title_string.data(), SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, size.width, size.height, flags);

    if (m_window == nullptr) {
      std::cerr << "Unable to create window: " << SDL_GetError() << '\n';
      return;
    }
  }